

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O3

void __thiscall QWaitCondition::QWaitCondition(QWaitCondition *this)

{
  QWaitConditionPrivate *pQVar1;
  int iVar2;
  pthread_mutex_t *__mutex;
  long in_FS_OFFSET;
  pthread_condattr_t local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  __mutex = (pthread_mutex_t *)operator_new(0x60);
  this->d = (QWaitConditionPrivate *)__mutex;
  iVar2 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  if (iVar2 != 0) {
    qErrnoWarning(iVar2,"%s: %s failure","QWaitCondition","mutex init");
  }
  pQVar1 = this->d;
  local_24.__align = -0x55555556;
  pthread_condattr_init(&local_24);
  pthread_condattr_setclock(&local_24,1);
  iVar2 = pthread_cond_init((pthread_cond_t *)&pQVar1->cond,&local_24);
  if (iVar2 != 0) {
    qErrnoWarning(iVar2,"%s: %s failure","QWaitCondition","cv init");
  }
  pthread_condattr_destroy(&local_24);
  pQVar1 = this->d;
  pQVar1->waiters = 0;
  pQVar1->wakeups = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWaitCondition::QWaitCondition()
{
    d = new QWaitConditionPrivate;
    qt_report_pthread_error(pthread_mutex_init(&d->mutex, nullptr), "QWaitCondition", "mutex init");
    qt_initialize_pthread_cond(&d->cond, "QWaitCondition");
    d->waiters = d->wakeups = 0;
}